

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  int iVar3;
  Node *node_00;
  Node *element;
  uint uVar4;
  int local_38;
  int local_34;
  int HasBase;
  int HasTitle;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *head_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node_00 == (Node *)0x0) {
      return;
    }
    if ((node_00->tag == head->tag) && (node_00->type == EndTag)) break;
    if (((node_00->tag == head->tag) ||
        (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
         (node_00->tag->id == TidyTag_HTML)))) && (node_00->type == StartTag)) {
      prvTidyReport(doc,head,node_00,0x235);
      prvTidyFreeNode(doc,node_00);
    }
    else {
      BVar2 = prvTidynodeIsText(node_00);
      if (BVar2 != no) {
        if (((int)(doc->config).value[0x3b].v == 0) && ((int)(doc->config).value[6].v != 1)) {
          prvTidyReport(doc,head,node_00,0x27e);
        }
        prvTidyUngetToken(doc);
        return;
      }
      if (((node_00->type == ProcInsTag) && (node_00->element != (tmbstr)0x0)) &&
         (iVar3 = prvTidytmbstrcmp(node_00->element,"xml-stylesheet"), iVar3 == 0)) {
        prvTidyReport(doc,head,node_00,0x27e);
        element = prvTidyFindHTML(doc);
        prvTidyInsertNodeBeforeElement(element,node_00);
      }
      else {
        BVar2 = InsertMisc(head,node_00);
        if (BVar2 == no) {
          if (node_00->type == DocTypeTag) {
            InsertDocType(doc,head,node_00);
          }
          else if (node_00->tag == (Dict *)0x0) {
            prvTidyReport(doc,head,node_00,0x235);
            prvTidyFreeNode(doc,node_00);
          }
          else {
            if ((node_00->tag->model & 4) == 0) {
              if (pLVar1->isvoyager != no) {
                prvTidyReport(doc,head,node_00,0x27e);
              }
              prvTidyUngetToken(doc);
              return;
            }
            BVar2 = prvTidynodeIsElement(node_00);
            if (BVar2 == no) {
              prvTidyReport(doc,head,node_00,0x235);
              prvTidyFreeNode(doc,node_00);
            }
            else {
              if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
                 (node_00->tag->id != TidyTag_TITLE)) {
                if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
                   ((node_00->tag->id == TidyTag_BASE && (local_38 = local_38 + 1, 1 < local_38))))
                {
                  uVar4 = 0x280;
                  if (head != (Node *)0x0) {
                    uVar4 = 0x27f;
                  }
                  prvTidyReport(doc,head,node_00,uVar4);
                }
              }
              else {
                local_34 = local_34 + 1;
                if (1 < local_34) {
                  uVar4 = 0x280;
                  if (head != (Node *)0x0) {
                    uVar4 = 0x27f;
                  }
                  prvTidyReport(doc,head,node_00,uVar4);
                }
              }
              prvTidyInsertNodeAtEnd(head,node_00);
              ParseTag(doc,node_00,IgnoreWhitespace);
            }
          }
        }
      }
    }
  }
  prvTidyFreeNode(doc,node_00);
  head->closed = yes;
  return;
}

Assistant:

void TY_(ParseHead)(TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;

    DEBUG_LOG(SPRTF("Enter ParseHead...\n"));
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseHead 1...\n"));
}